

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O1

RunElement * __thiscall
duckdb::
MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
::ReplayGames(RunElement *__return_storage_ptr__,
             MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
             *this,Games *losers,idx_t slot_idx,RunElement *insert_val)

{
  pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *ppVar1;
  ulong uVar2;
  unsigned_long uVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  ulong uVar9;
  
  uVar7 = (insert_val->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
          super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       (insert_val->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
       super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
       _M_head_impl;
  (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar7;
  uVar6 = insert_val->second;
  __return_storage_ptr__->second = uVar6;
  uVar5 = slot_idx + 0x1f;
  uVar7 = (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
          super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
          _M_head_impl;
  uVar8 = (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
          super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  do {
    uVar9 = uVar5 - 1;
    uVar5 = uVar9 >> 1;
    ppVar1 = losers->_M_elems + uVar5;
    uVar2 = (ppVar1->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
            super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    if ((uVar2 < uVar8) ||
       ((uVar2 <= uVar8 &&
        ((ppVar1->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
         super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
         _M_head_impl < uVar7)))) {
LAB_017de8d0:
      (ppVar1->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar8;
      uVar8 = (ppVar1->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
              super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
              _M_head_impl;
      uVar3 = ppVar1->second;
      (ppVar1->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = uVar7;
      ppVar1->second = uVar6;
      uVar6 = uVar3;
      uVar7 = uVar8;
      uVar8 = uVar2;
    }
    else {
      bVar4 = uVar8 < uVar2;
      if (uVar2 == uVar8) {
        bVar4 = uVar7 < (ppVar1->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                        super__Tuple_impl<1UL,_unsigned_long>.
                        super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
      }
      if ((!bVar4) && (ppVar1->second < uVar6)) goto LAB_017de8d0;
    }
    if (uVar9 < 2) {
      __return_storage_ptr__->second = uVar6;
      (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar8;
      (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = uVar7;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

RunElement ReplayGames(Games &losers, idx_t slot_idx, const RunElement &insert_val) {
		RunElement smallest = insert_val;
		//	Start at a fake level below
		auto idx = slot_idx + losers.size();
		do {
			// Parent index
			idx = (idx - 1) / 2;
			// swap if out of order
			if (cmp(losers[idx], smallest)) {
				std::swap(losers[idx], smallest);
			}
		} while (idx);

		return smallest;
	}